

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_semaphores.cpp
# Opt level: O1

void semaphores_in_module(uint W)

{
  char *pcVar1;
  int *piVar2;
  unsigned_long *puVar3;
  code *pcVar4;
  double dVar5;
  long *plVar6;
  FlowBuilder this;
  char extraout_AL;
  bool bVar7;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  int iVar8;
  pthread_mutex_t *__mutex;
  ulong uVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  size_t N;
  Task t;
  anon_union_24_2_13149d16_for_String_2 local_3e0;
  ResultBuilder DOCTEST_RB;
  in_place_type_t<tf::Node::Module> local_34a;
  DefaultTaskParams local_349;
  Expression_lhs<const_unsigned_long_&> local_348;
  vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> semaphores;
  size_t counter;
  pthread_mutex_t *local_318;
  Task m;
  shared_ptr<tf::WorkerInterface> local_308;
  Taskflow taskflow2;
  Taskflow taskflow1;
  Executor executor;
  
  taskflow1.super_FlowBuilder._graph = &taskflow1._graph;
  taskflow1._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow1._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow1._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow1._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  taskflow1._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  taskflow1._name._M_dataplus._M_p = (pointer)&taskflow1._name.field_2;
  taskflow1._name._M_string_length = 0;
  taskflow1._name.field_2._M_local_buf[0] = '\0';
  taskflow1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow1._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow1._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow1._topologies,0);
  taskflow1._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  taskflow2.super_FlowBuilder._graph = &taskflow2._graph;
  taskflow2._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow2._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow2._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow2._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  taskflow2._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  taskflow2._name._M_dataplus._M_p = (pointer)&taskflow2._name.field_2;
  taskflow2._name._M_string_length = 0;
  taskflow2._name.field_2._M_local_buf[0] = '\0';
  taskflow2._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow2._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow2._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow2._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow2._topologies,0);
  taskflow2._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_308);
  if (local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::vector
            (&semaphores,10,(allocator_type *)&DOCTEST_RB);
  local_318 = (pthread_mutex_t *)
              semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>._M_impl.
      super__Vector_impl_data._M_start !=
      semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __mutex = (pthread_mutex_t *)
              semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0xe7;
      DOCTEST_RB.super_AssertData.m_expr = "sema.value() == 0";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      iVar8 = pthread_mutex_lock(__mutex);
      if (iVar8 != 0) {
        std::__throw_system_error(iVar8);
      }
      puVar3 = *(unsigned_long **)((long)__mutex + 0x30);
      pthread_mutex_unlock(__mutex);
      local_348.m_at = DT_REQUIRE;
      N = N & 0xffffffff00000000;
      local_348.lhs = puVar3;
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                ((Result *)&t,(Expression_lhs<unsigned_long_const> *)&local_348,(int *)&N);
      doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,(String *)&local_3e0.data);
      DOCTEST_RB.super_AssertData._40_2_ =
           CONCAT11(DOCTEST_RB.super_AssertData.m_threw,t._node._0_1_) ^ 1;
      uVar10 = extraout_XMM0_Da;
      uVar11 = extraout_XMM0_Db;
      if ((local_3e0.buf[0x17] < '\0') && (local_3e0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3e0.data.ptr);
        uVar10 = extraout_XMM0_Da_00;
        uVar11 = extraout_XMM0_Db_00;
      }
      dVar5 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL != '\0') {
        pcVar4 = (code *)swi(3);
        (*pcVar4)(SUB84(dVar5,0));
        return;
      }
      if ((DOCTEST_RB.super_AssertData.m_failed == true) &&
         (bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at), bVar7)) {
        doctest::detail::throwException();
      }
      if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
      {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
      }
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0xe8;
      DOCTEST_RB.super_AssertData.m_expr = "sema.max_value() == 0";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_348.lhs = (unsigned_long *)__mutex[1].__align;
      local_348.m_at = DT_REQUIRE;
      N = N & 0xffffffff00000000;
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                ((Result *)&t,(Expression_lhs<unsigned_long_const> *)&local_348,(int *)&N);
      doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,(String *)&local_3e0.data);
      DOCTEST_RB.super_AssertData._40_2_ =
           CONCAT11(DOCTEST_RB.super_AssertData.m_threw,t._node._0_1_) ^ 1;
      uVar10 = extraout_XMM0_Da_01;
      uVar11 = extraout_XMM0_Db_01;
      if ((local_3e0.buf[0x17] < '\0') && (local_3e0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3e0.data.ptr);
        uVar10 = extraout_XMM0_Da_02;
        uVar11 = extraout_XMM0_Db_02;
      }
      dVar5 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL_00 != '\0') {
        pcVar4 = (code *)swi(3);
        (*pcVar4)(SUB84(dVar5,0));
        return;
      }
      if ((DOCTEST_RB.super_AssertData.m_failed == true) &&
         (bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at), bVar7)) {
        doctest::detail::throwException();
      }
      if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
      {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
      }
      iVar8 = pthread_mutex_lock(__mutex);
      if (iVar8 != 0) {
        std::__throw_system_error(iVar8);
      }
      __mutex[1].__align = 2;
      *(undefined8 *)((long)__mutex + 0x30) = 2;
      *(undefined8 *)((long)__mutex + 0x40) = *(undefined8 *)((long)__mutex + 0x38);
      pthread_mutex_unlock(__mutex);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0xea;
      DOCTEST_RB.super_AssertData.m_expr = "sema.value() == 2";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      iVar8 = pthread_mutex_lock(__mutex);
      if (iVar8 != 0) {
        std::__throw_system_error(iVar8);
      }
      puVar3 = *(unsigned_long **)((long)__mutex + 0x30);
      pthread_mutex_unlock(__mutex);
      local_348.m_at = DT_REQUIRE;
      N = CONCAT44(N._4_4_,2);
      local_348.lhs = puVar3;
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                ((Result *)&t,(Expression_lhs<unsigned_long_const> *)&local_348,(int *)&N);
      doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,(String *)&local_3e0.data);
      DOCTEST_RB.super_AssertData._40_2_ =
           CONCAT11(DOCTEST_RB.super_AssertData.m_threw,t._node._0_1_) ^ 1;
      uVar10 = extraout_XMM0_Da_03;
      uVar11 = extraout_XMM0_Db_03;
      if ((local_3e0.buf[0x17] < '\0') && (local_3e0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3e0.data.ptr);
        uVar10 = extraout_XMM0_Da_04;
        uVar11 = extraout_XMM0_Db_04;
      }
      dVar5 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL_01 != '\0') {
        pcVar4 = (code *)swi(3);
        (*pcVar4)(SUB84(dVar5,0));
        return;
      }
      if ((DOCTEST_RB.super_AssertData.m_failed == true) &&
         (bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at), bVar7)) {
        doctest::detail::throwException();
      }
      if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
      {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
      }
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0xeb;
      DOCTEST_RB.super_AssertData.m_expr = "sema.max_value() == 2";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_348.lhs = (unsigned_long *)__mutex[1].__align;
      local_348.m_at = DT_REQUIRE;
      N = CONCAT44(N._4_4_,2);
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                ((Result *)&t,(Expression_lhs<unsigned_long_const> *)&local_348,(int *)&N);
      doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,(String *)&local_3e0.data);
      DOCTEST_RB.super_AssertData._40_2_ =
           CONCAT11(DOCTEST_RB.super_AssertData.m_threw,t._node._0_1_) ^ 1;
      uVar10 = extraout_XMM0_Da_05;
      uVar11 = extraout_XMM0_Db_05;
      if ((local_3e0.buf[0x17] < '\0') && (local_3e0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3e0.data.ptr);
        uVar10 = extraout_XMM0_Da_06;
        uVar11 = extraout_XMM0_Db_06;
      }
      dVar5 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL_02 != '\0') {
        pcVar4 = (code *)swi(3);
        (*pcVar4)(SUB84(dVar5,0));
        return;
      }
      if ((DOCTEST_RB.super_AssertData.m_failed == true) &&
         (bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at), bVar7)) {
        doctest::detail::throwException();
      }
      if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
      {
        operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                           DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
      }
      __mutex = (pthread_mutex_t *)((long)__mutex + 0x60);
    } while (__mutex != local_318);
  }
  N = 0x400;
  counter = 0;
  uVar9 = 0;
  do {
    this._graph = taskflow1.super_FlowBuilder._graph;
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
    ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
    *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
         &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
    *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
    *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
    pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
    (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
    *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
    *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
    *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
         &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
    *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
    *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout = 0.0;
    *(size_t **)&DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = &counter;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
         (char *)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp:242:32)>
                 ::_M_invoke;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
         (double)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp:242:32)>
                 ::_M_manager;
    *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)this._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
    if (DOCTEST_RB.super_AssertData.m_test_case != (TestCaseData *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&DOCTEST_RB,
                 (Node *)DOCTEST_RB.super_AssertData.m_test_case);
    }
    t._node = ((this._graph)->
              super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ).
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
              super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
              super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
              super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    tf::Task::
    acquire<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
              (&t,(__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                   )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                    _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    tf::Task::
    release<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
              (&t,(__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                   )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                    _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    uVar9 = uVar9 + 1;
  } while (uVar9 < N);
  DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)0x0;
  t._node = (Node *)0x0;
  local_348.lhs = (unsigned_long *)((ulong)local_348.lhs & 0xffffffff00000000);
  m._node = tf::Graph::
            _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Module>,tf::Taskflow&>
                      (taskflow2.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                       &local_349,(void **)&DOCTEST_RB,&t._node,(int *)&local_348,&local_34a,
                       &taskflow1);
  tf::Task::
  acquire<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
            (&m,(__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                 )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                  _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
              )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>._M_impl.
               super__Vector_impl_data._M_finish);
  tf::Task::
  release<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
            (&m,(__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                 )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>.
                  _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
              )semaphores.super__Vector_base<tf::Semaphore,_std::allocator<tf::Semaphore>_>._M_impl.
               super__Vector_impl_data._M_finish);
  t._node = (Node *)0x1;
  tf::Executor::
  run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
            ((Future<void> *)&DOCTEST_RB,&executor,&taskflow2,(anon_class_8_1_69701ed9 *)&t,
             (anon_class_1_0_00000001 *)&local_348);
  std::future<void>::get((future<void> *)&DOCTEST_RB);
  plVar6 = (long *)CONCAT44(DOCTEST_RB.super_AssertData._28_4_,DOCTEST_RB.super_AssertData.m_line);
  if (plVar6 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar2 = (int *)((long)plVar6 + 0xc);
      iVar8 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
    }
    else {
      iVar8 = *(int *)((long)plVar6 + 0xc);
      *(int *)((long)plVar6 + 0xc) = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (**(code **)(*plVar6 + 0x18))();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(DOCTEST_RB.super_AssertData._12_4_,DOCTEST_RB.super_AssertData.m_at) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(DOCTEST_RB.super_AssertData._12_4_,DOCTEST_RB.super_AssertData.m_at));
  }
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_semaphores.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0xfd;
  DOCTEST_RB.super_AssertData.m_expr = "counter == N";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_348.lhs = &counter;
  local_348.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<unsigned_long,_nullptr>
            ((Result *)&t,&local_348,&N);
  doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,(String *)&local_3e0.data);
  DOCTEST_RB.super_AssertData._40_2_ =
       CONCAT11(DOCTEST_RB.super_AssertData.m_threw,t._node._0_1_) ^ 1;
  uVar10 = extraout_XMM0_Da_07;
  uVar11 = extraout_XMM0_Db_07;
  if ((local_3e0.buf[0x17] < '\0') && (local_3e0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3e0.data.ptr);
    uVar10 = extraout_XMM0_Da_08;
    uVar11 = extraout_XMM0_Db_08;
  }
  dVar5 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_03 == '\0') {
    if ((DOCTEST_RB.super_AssertData.m_failed == true) &&
       (bVar7 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at), bVar7)) {
      doctest::detail::throwException();
    }
    if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                         DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]));
    }
    std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::~vector(&semaphores);
    tf::Executor::~Executor(&executor);
    tf::Taskflow::~Taskflow(&taskflow2);
    tf::Taskflow::~Taskflow(&taskflow1);
    return;
  }
  pcVar4 = (code *)swi(3);
  (*pcVar4)(SUB84(dVar5,0));
  return;
}

Assistant:

void semaphores_in_module(unsigned W) {
  
  tf::Taskflow taskflow1;
  tf::Taskflow taskflow2;
  tf::Executor executor(W);
  std::vector<tf::Semaphore> semaphores(10);

  for(auto& sema : semaphores) {
    REQUIRE(sema.value() == 0);
    REQUIRE(sema.max_value() == 0);
    sema.reset(2);
    REQUIRE(sema.value() == 2);
    REQUIRE(sema.max_value() == 2);
  }

  size_t N = 1024;
  size_t counter {0};  

  for(size_t i=0; i<N; i=i+1){
    auto t = taskflow1.emplace([&](){ counter++; });
    t.acquire(semaphores.begin(), semaphores.end());
    t.release(semaphores.begin(), semaphores.end());
  }

  auto m = taskflow2.composed_of(taskflow1);

  m.acquire(semaphores.begin(), semaphores.end());
  m.release(semaphores.begin(), semaphores.end()); 

  executor.run(taskflow2).get();
  REQUIRE(counter == N);
}